

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O0

int __thiscall CVmTimeZoneCache::load_db_index(CVmTimeZoneCache *this)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  size_t sVar4;
  unsigned_long uVar5;
  void *pvVar6;
  ulong uVar7;
  char *str;
  AbbrHashEntry *this_00;
  AbbrHashEntry *len_00;
  long lVar8;
  int *in_RDI;
  ZoneHashEntry *zone;
  uint32_t zi_1;
  int ei;
  AbbrHashEntry *e_1;
  int entry_cnt;
  size_t len_2;
  char *p_2;
  char *abbr_end;
  ZoneHashEntry *e_to;
  uint to;
  size_t len_1;
  char *p_1;
  char *link_end;
  ZoneHashEntry *e;
  size_t len;
  char *p;
  int zi;
  char *zone_end;
  ZoneHashEntry **zone_index;
  uint32_t abbr_table_len;
  uint32_t link_table_len;
  uint32_t zone_cnt;
  uint32_t zone_table_len;
  int ok;
  char buf [24];
  osfildef *fp;
  undefined8 in_stack_fffffffffffffe88;
  CVmHashFunc *in_stack_fffffffffffffe90;
  AbbrHashEntry *this_01;
  uint32_t in_stack_fffffffffffffe98;
  int in_stack_fffffffffffffe9c;
  ZoneHashEntry *in_stack_fffffffffffffea0;
  ZoneHashEntry *in_stack_fffffffffffffea8;
  ZoneHashEntryDb *in_stack_fffffffffffffeb0;
  char *in_stack_fffffffffffffeb8;
  ZoneHashEntryLink *in_stack_fffffffffffffec0;
  long local_128;
  byte local_fc;
  byte local_fb;
  byte local_fa;
  bool local_f9;
  int local_e4;
  byte *local_c8;
  byte *local_a0;
  byte *local_70;
  int local_64;
  void *local_58;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  int local_38 [4];
  undefined1 auStack_28 [4];
  undefined1 auStack_24 [12];
  FILE *local_18;
  uint local_4;
  
  if (*in_RDI == 0) {
    *in_RDI = 1;
    local_18 = (FILE *)open_zoneinfo_file();
    if (local_18 == (FILE *)0x0) {
      local_4 = 0;
    }
    else {
      sVar4 = fread(local_38,0x18,1,local_18);
      local_f9 = sVar4 == 1 && local_38[0] == 0x5a543354;
      local_3c = (uint)local_f9;
      local_40 = 0;
      local_44 = 0;
      if (local_3c != 0) {
        uVar5 = ::osrp4(auStack_28);
        local_40 = (int)uVar5 - 4;
        uVar5 = ::osrp4(auStack_24);
        local_44 = (uint)uVar5;
        pvVar6 = operator_new__((ulong)local_40);
        *(void **)(in_RDI + 0xe) = pvVar6;
        local_fa = 0;
        if (*(long *)(in_RDI + 0xe) != 0) {
          sVar4 = fread(*(void **)(in_RDI + 0xe),(ulong)local_40,1,local_18);
          local_fa = sVar4 != 1 ^ 0xff;
        }
        local_3c = (uint)(local_fa & 1);
      }
      local_48 = 0;
      if ((local_3c != 0) && (sVar4 = fread(local_38,8,1,local_18), sVar4 == 1)) {
        uVar5 = ::osrp4(local_38);
        local_48 = (int)uVar5 - 4;
        pvVar6 = operator_new__((ulong)local_48);
        *(void **)(in_RDI + 0x10) = pvVar6;
        local_fb = 0;
        if (*(long *)(in_RDI + 0x10) != 0) {
          sVar4 = fread(*(void **)(in_RDI + 0x10),(ulong)local_48,1,local_18);
          local_fb = sVar4 != 1 ^ 0xff;
        }
        local_3c = (uint)(local_fb & 1);
      }
      local_4c = 0;
      if ((local_3c != 0) && (sVar4 = fread(local_38,8,1,local_18), sVar4 == 1)) {
        uVar5 = ::osrp4(local_38);
        local_4c = (int)uVar5 - 4;
        pvVar6 = operator_new__((ulong)local_4c);
        *(void **)(in_RDI + 0x12) = pvVar6;
        local_fc = 0;
        if (*(long *)(in_RDI + 0x12) != 0) {
          sVar4 = fread(*(void **)(in_RDI + 0x12),(ulong)local_4c,1,local_18);
          local_fc = sVar4 != 1 ^ 0xff;
        }
        local_3c = (uint)(local_fc & 1);
      }
      fclose(local_18);
      local_58 = (void *)0x0;
      if (local_3c != 0) {
        uVar7 = SUB168(ZEXT416(local_44) * ZEXT816(8),0);
        if (SUB168(ZEXT416(local_44) * ZEXT816(8),8) != 0) {
          uVar7 = 0xffffffffffffffff;
        }
        local_58 = operator_new__(uVar7);
        lVar3 = *(long *)(in_RDI + 0xe);
        local_64 = 0;
        for (local_70 = *(byte **)(in_RDI + 0xe); local_70 < (byte *)(lVar3 + (ulong)local_40);
            local_70 = local_70 + (ulong)bVar1 + 8) {
          bVar1 = *local_70;
          pvVar6 = operator_new(0x48);
          ::osrp4(local_70 + (ulong)bVar1 + 2);
          ZoneHashEntryDb::ZoneHashEntryDb
                    (in_stack_fffffffffffffeb0,(char *)in_stack_fffffffffffffea8,
                     (size_t)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                     in_stack_fffffffffffffe98,(char *)in_stack_fffffffffffffe90);
          CVmHashTable::add((CVmHashTable *)in_stack_fffffffffffffea0,
                            (CVmHashEntry *)
                            CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          *(void **)((long)local_58 + (long)local_64 * 8) = pvVar6;
          local_64 = local_64 + 1;
        }
        lVar3 = *(long *)(in_RDI + 0x10);
        for (local_a0 = *(byte **)(in_RDI + 0x10); local_a0 < (byte *)(lVar3 + (ulong)local_48);
            local_a0 = local_a0 + (ulong)bVar1 + 6) {
          bVar1 = *local_a0;
          uVar5 = ::osrp4(local_a0 + (ulong)bVar1 + 2);
          if ((uint)uVar5 < local_44) {
            local_128 = *(long *)((long)local_58 + (uVar5 & 0xffffffff) * 8);
          }
          else {
            local_128 = 0;
          }
          if (local_128 != 0) {
            operator_new(0x50);
            ZoneHashEntryLink::ZoneHashEntryLink
                      (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                       (size_t)in_stack_fffffffffffffeb0,
                       (int)((ulong)in_stack_fffffffffffffea8 >> 0x20),in_stack_fffffffffffffea0);
            CVmHashTable::add((CVmHashTable *)in_stack_fffffffffffffea0,
                              (CVmHashEntry *)
                              CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          }
        }
      }
      if (local_3c != 0) {
        str = (char *)operator_new(0x20);
        this_00 = (AbbrHashEntry *)operator_new(8);
        (this_00->super_CVmHashEntryCI).super_CVmHashEntry._vptr_CVmHashEntry = (_func_int **)0x0;
        CVmHashFuncCI::CVmHashFuncCI((CVmHashFuncCI *)in_stack_fffffffffffffe90);
        CVmHashTable::CVmHashTable
                  ((CVmHashTable *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe9c,
                   in_stack_fffffffffffffe90,(int)((ulong)in_stack_fffffffffffffe88 >> 0x20));
        *(char **)(in_RDI + 10) = str;
        lVar3 = *(long *)(in_RDI + 0x12);
        local_c8 = *(byte **)(in_RDI + 0x12);
        while (local_c8 < (byte *)(lVar3 + (ulong)local_4c)) {
          bVar1 = *local_c8;
          bVar2 = local_c8[(ulong)bVar1 + 2];
          len_00 = (AbbrHashEntry *)operator_new(0x30);
          AbbrHashEntry::AbbrHashEntry
                    (this_00,str,(size_t)len_00,(int)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                     (int)in_stack_fffffffffffffea8);
          CVmHashTable::add((CVmHashTable *)in_stack_fffffffffffffea0,
                            (CVmHashEntry *)
                            CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          local_c8 = local_c8 + (ulong)bVar1 + 3;
          for (local_e4 = 0; local_e4 < (int)(uint)bVar2; local_e4 = local_e4 + 1) {
            uVar5 = ::osrp4(local_c8);
            if ((uint)uVar5 < local_44) {
              in_stack_fffffffffffffea0 =
                   *(ZoneHashEntry **)((long)local_58 + (uVar5 & 0xffffffff) * 8);
            }
            else {
              in_stack_fffffffffffffea0 = (ZoneHashEntry *)0x0;
            }
            this_01 = len_00;
            in_stack_fffffffffffffe9c = local_e4;
            in_stack_fffffffffffffea8 = in_stack_fffffffffffffea0;
            lVar8 = ::osrp4s(local_c8 + 4);
            AbbrHashEntry::set_zone
                      (this_01,in_stack_fffffffffffffe9c,in_stack_fffffffffffffea0,(int32_t)lVar8,
                       local_c8[8]);
            local_c8 = local_c8 + 9;
          }
        }
      }
      if ((local_58 != (void *)0x0) && (local_58 != (void *)0x0)) {
        operator_delete__(local_58);
      }
      in_RDI[1] = local_3c;
      local_4 = local_3c;
    }
  }
  else {
    local_4 = in_RDI[1];
  }
  return local_4;
}

Assistant:

int CVmTimeZoneCache::load_db_index(VMG0_)
{
    /* if we've already loaded the index (or tried to), we're done */
    if (index_loaded_)
        return index_loaded_ok_;

    /* we've now tried loading the index */
    index_loaded_ = TRUE;

    /* open the zone file */
    osfildef *fp = open_zoneinfo_file(vmg0_);
    if (fp == 0)
        return FALSE;

    /* read the signature */
    char buf[24];
    int ok = !osfrb(fp, buf, 24) && memcmp(buf, "T3TZ", 4) == 0;

    /* if the signature checked out, read the zone table */
    uint32_t zone_table_len = 0, zone_cnt = 0;
    if (ok)
    {
        /* decode the zone name table length */
        zone_table_len = osrp4(buf + 16) - 4;
        zone_cnt = osrp4(buf + 20);
        
        /* allocate space to load the table */
        zone_bytes_ = new char[zone_table_len];

        /* read the table */
        ok = zone_bytes_ != 0 && !osfrb(fp, zone_bytes_, zone_table_len);
    }

    /* if everything is working so far, read the link table */
    uint32_t link_table_len = 0;
    if (ok && !osfrb(fp, buf, 8))
    {
        /* load the link table */
        link_table_len = osrp4(buf) - 4;
        /* uint32_t link_cnt = osrp4(buf+4) - not currently needed */
        link_bytes_ = new char[link_table_len];
        ok = link_bytes_ != 0 && !osfrb(fp, link_bytes_, link_table_len);
    }

    /* if we're still good, read the abbreviation mappings */
    uint32_t abbr_table_len = 0;
    if (ok && !osfrb(fp, buf, 8))
    {
        /* load the abbreviation table */
        abbr_table_len = osrp4(buf) - 4;
        /* uint32_t abbr_cnt = osrp4(buf + 4) - not currently needed */
        abbr_bytes_ = new char[abbr_table_len];
        ok = abbr_bytes_ != 0 && !osfrb(fp, abbr_bytes_, abbr_table_len);
    }

    /* we're done with the file */
    osfcls(fp);

    /* if we read the zone table successfully, create a hash table from it */
    ZoneHashEntry **zone_index = 0;
    if (ok)
    {
        /* create the numerical index */
        zone_index = new ZoneHashEntry *[zone_cnt];

        /* populate it */
        const char *zone_end = zone_bytes_ + zone_table_len;
        int zi = 0;
        for (const char *p = zone_bytes_ ; p < zone_end ; )
        {
            /* read and skip the name length prefix */
            size_t len = osrp1(p);
            ++p;

            /* create this entry */
            ZoneHashEntry *e = new ZoneHashEntryDb(
                p, len, FALSE, osrp4(p+len+1), p+len+1+4);

            /* add it to the hash table and zone index */
            db_tab_->add(e);
            zone_index[zi++] = e;

            /* skip the name, seek pointer, and country code */
            p += len + 1 + 4 + 2;
        }

        /* read the links */
        const char *link_end = link_bytes_ + link_table_len;
        for (const char *p = link_bytes_ ; p < link_end ; )
        {
            /* read and skip the name length */
            size_t len = osrp1(p);
            ++p;

            /* read the TO index */
            unsigned int to = osrp4(p + len + 1);
            
            /* look up the TO field */
            ZoneHashEntry *e_to = (to < zone_cnt ? zone_index[to] : 0);

            /* if we found it, create the new entry for the FROM */
            if (e_to != 0)
                db_tab_->add(new ZoneHashEntryLink(p, len, FALSE, e_to));

            /* skip the entry */
            p += len + 1 + 4;
        }
    }

    /* if there are no errors so far, read the abbreviation table */
    if (ok)
    {
        /* create the abbreviation hash table */
        abbr_tab_ = new CVmHashTable(64, new CVmHashFuncCI(), TRUE);

        /* populate it */
        const char *abbr_end = abbr_bytes_ + abbr_table_len;
        for (const char *p = abbr_bytes_ ; p < abbr_end ; )
        {
            /* read and skip the abbreviation length prefix */
            size_t len = osrp1(p);
            ++p;

            /* read the number of zone entries */
            int entry_cnt = osrp1(p + len + 1);

            /* create and add the hash table entry */
            AbbrHashEntry *e = new AbbrHashEntry(p, len, FALSE, entry_cnt);
            abbr_tab_->add(e);

            /* populate the entry */
            int ei;
            for (p += len + 1 + 1, ei = 0 ; ei < entry_cnt ; p += 9, ++ei)
            {
                /* look up the zone */
                uint32_t zi = osrp4(p);
                ZoneHashEntry *zone = (zi < zone_cnt ? zone_index[zi] : 0);
                
                /* add the entry */
                e->set_zone(ei, zone, osrp4s(p+4), p[8]);
            }
        }
    }

    /* we're done with the numerical zone index */
    if (zone_index != 0)
        delete [] zone_index;

    /* return the status */
    index_loaded_ok_ = ok;
    return ok;
}